

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O0

void __thiscall PatternModel::selectRow(PatternModel *this,int row)

{
  PatternAnchor end;
  PatternAnchor start;
  int iVar1;
  PatternCursorBase local_3c;
  PatternCursorBase local_30;
  PatternCursorBase local_20;
  int local_14;
  PatternModel *pPStack_10;
  int row_local;
  PatternModel *this_local;
  
  if (-1 < row) {
    local_14 = row;
    pPStack_10 = this;
    iVar1 = trackerboy::Pattern::totalRows(&this->mPatternCurr);
    if (row < iVar1) {
      if ((this->mHasSelection & 1U) == 0) {
        this->mHasSelection = true;
        PatternAnchor::PatternAnchor((PatternAnchor *)&local_20,local_14,0,0);
        local_30.row = local_20.row;
        local_30.column = local_20.column;
        local_30.track = local_20.track;
        start.super_PatternCursorBase.track = local_20.track;
        start.super_PatternCursorBase.row = local_20.row;
        start.super_PatternCursorBase.column = local_20.column;
        PatternSelection::setStart(&this->mSelection,start);
      }
      PatternAnchor::PatternAnchor((PatternAnchor *)&local_3c,local_14,4,3);
      end.super_PatternCursorBase.track = local_3c.track;
      end.super_PatternCursorBase.row = local_3c.row;
      end.super_PatternCursorBase.column = local_3c.column;
      PatternSelection::setEnd(&this->mSelection,end);
      selectionChanged(this);
    }
  }
  return;
}

Assistant:

void PatternModel::selectRow(int row) {
    if (row >= 0 && row < (int)mPatternCurr.totalRows()) {
        if (!mHasSelection) {
            mHasSelection = true;
            mSelection.setStart({row, 0, 0});
        }
        mSelection.setEnd({row, PatternAnchor::MAX_SELECTS - 1, PatternAnchor::MAX_TRACKS - 1});
        emit selectionChanged();
    }
}